

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void * drawnumber_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_float tVar1;
  bool bVar2;
  int iVar3;
  t_pd *pp_Var4;
  _glist *p_Var5;
  t_symbol *ptVar6;
  t_pd p_Var7;
  t_atom *argv_00;
  t_atom *argv_01;
  int iVar8;
  
  pp_Var4 = pd_new(drawnumber_class);
  *(undefined2 *)(pp_Var4 + 0x16) = 1;
  *(undefined4 *)(pp_Var4 + 0x17) = 0x3f800000;
  pp_Var4[0x18] = (t_pd)0x0;
  pp_Var4[0x19] = (t_pd)0x0;
  *(undefined4 *)(pp_Var4 + 0x1a) = 0;
  p_Var5 = canvas_getcurrent();
  pp_Var4[0x1c] = (t_pd)p_Var5;
  do {
    ptVar6 = atom_getsymbolarg(0,argc,argv);
    iVar3 = strcmp(ptVar6->s_name,"-v");
    bVar2 = 1 < argc;
    if (bVar2 && iVar3 == 0) {
      if (argv[1].a_type == A_SYMBOL) {
        fielddesc_setfloat_var((_fielddesc *)(pp_Var4 + 0x16),argv[1].a_w.w_symbol);
      }
      else {
        tVar1 = argv[1].a_w.w_float;
        *(undefined2 *)(pp_Var4 + 0x16) = 1;
        *(t_float *)(pp_Var4 + 0x17) = tVar1;
        pp_Var4[0x18] = (t_pd)0x0;
        pp_Var4[0x19] = (t_pd)0x0;
        *(undefined4 *)(pp_Var4 + 0x1a) = 0;
      }
      argc = argc - 2;
      argv = argv + 2;
    }
  } while (bVar2 && iVar3 == 0);
  iVar3 = 0;
  p_Var7 = (t_pd)atom_getsymbolarg(0,argc,argv);
  pp_Var4[6] = p_Var7;
  argv_00 = argv + (argc != 0);
  if ((uint)argc < 2) {
    *(undefined2 *)(pp_Var4 + 7) = 1;
    *(undefined4 *)(pp_Var4 + 8) = 0;
    pp_Var4[9] = (t_pd)0x0;
    pp_Var4[10] = (t_pd)0x0;
    *(undefined4 *)(pp_Var4 + 0xb) = 0;
    argv_01 = argv_00;
  }
  else {
    iVar8 = argc - 1;
    if (argc == 0) {
      iVar8 = iVar3;
    }
    iVar3 = iVar8 + -1;
    argv_01 = argv_00 + 1;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var4 + 7),iVar8,argv_00);
  }
  if (iVar3 == 0) {
    *(undefined2 *)(pp_Var4 + 0xc) = 1;
    iVar8 = 0;
    *(undefined4 *)(pp_Var4 + 0xd) = 0;
    pp_Var4[0xe] = (t_pd)0x0;
    pp_Var4[0xf] = (t_pd)0x0;
    *(undefined4 *)(pp_Var4 + 0x10) = 0;
  }
  else {
    iVar8 = iVar3 + -1;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var4 + 0xc),iVar3,argv_01);
    argv_01 = argv_01 + 1;
  }
  if (iVar8 == 0) {
    *(undefined2 *)(pp_Var4 + 0x11) = 1;
    *(undefined4 *)(pp_Var4 + 0x12) = 0x3f800000;
    pp_Var4[0x13] = (t_pd)0x0;
    pp_Var4[0x14] = (t_pd)0x0;
    *(undefined4 *)(pp_Var4 + 0x15) = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = iVar8 + -1;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var4 + 0x11),iVar8,argv_01);
    argv_01 = argv_01 + 1;
  }
  if (iVar3 == 0) {
    ptVar6 = &s_;
  }
  else {
    ptVar6 = atom_getsymbolarg(0,iVar3,argv_01);
  }
  pp_Var4[0x1b] = (t_pd)ptVar6;
  return pp_Var4;
}

Assistant:

static void *drawnumber_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_drawnumber *x = (t_drawnumber *)pd_new(drawnumber_class);
    const char *classname = classsym->s_name;

    fielddesc_setfloat_const(&x->x_vis, 1);
    x->x_canvas = canvas_getcurrent();
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else break;
    }
        /* next argument is name of field to draw - we don't know its type yet
        but fielddesc_setfloatarg() will do fine here. */
    x->x_fieldname = atom_getsymbolarg(0, argc, argv);
    if (argc)
        argc--, argv++;
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_color, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_color, 1);
    if (argc)
        x->x_label = atom_getsymbolarg(0, argc, argv);
    else x->x_label = &s_;

    return (x);
}